

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<kj::_::HashBucket>::~Array(Array<kj::_::HashBucket> *this)

{
  Array<kj::_::HashBucket> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }